

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::SMdivideREM(Forth *this)

{
  uint uVar1;
  uint valueHi;
  anon_union_8_2_340ac67b_for_data_ local_68;
  SDCell reminder;
  SDCell quotent;
  SDCell d1;
  allocator<char> local_39;
  string local_38;
  anon_union_8_2_340ac67b_for_data_ local_18;
  SDCell n1;
  Forth *this_local;
  
  n1.data_ = (anon_union_8_2_340ac67b_for_data_)this;
  requireDStackDepth(this,3,"SM/REM");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  SDCell::SDCell((SDCell *)&local_18.Cells,(long)(int)uVar1);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if (local_18.Cells.lo == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"SM/REM: zero divisor",&local_39);
    throwCppExceptionMessage(this,&local_38,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  valueHi = ForthStack<unsigned_int>::getTop(&this->dStack);
  SDCell::SDCell(&quotent,uVar1,valueHi);
  SDCell::SDCell(&reminder,(long)quotent.data_ / CONCAT44(local_18.Cells.hi,local_18.Cells.lo));
  SDCell::SDCell((SDCell *)&local_68.Cells,
                 (long)quotent.data_ % CONCAT44(local_18.Cells.hi,local_18.Cells.lo));
  ForthStack<unsigned_int>::setTop(&this->dStack,0,reminder.data_.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,local_68.Cells.lo);
  return;
}

Assistant:

void SMdivideREM(){
			REQUIRE_DSTACK_DEPTH(3, "SM/REM");
			SDCell n1{ static_cast<SCell>(dStack.getTop()) }; dStack.pop();
			RUNTIME_ERROR_IF(n1.data_.Cells.lo == 0, "SM/REM: zero divisor", errorDivisionByZero);
			SDCell d1(dStack.getTop(1),dStack.getTop());
			SDCell quotent(d1.data_.Dcells / n1.data_.Dcells); // n3
			SDCell reminder(d1.data_.Dcells % n1.data_.Dcells); // n2
			dStack.setTop(0, quotent.data_.Cells.lo);
			dStack.setTop(1, reminder.data_.Cells.lo);
		}